

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O0

void __thiscall Am_Web_Data::Invalidate(Am_Web_Data *this,Am_Slot *slot_invalidated)

{
  bool bVar1;
  Output_Port *local_20;
  Output_Port *curr;
  Am_Slot *slot_invalidated_local;
  Am_Web_Data *this_local;
  
  this->valid = false;
  for (local_20 = this->out_list; local_20 != (Output_Port *)0x0; local_20 = local_20->next) {
    bVar1 = Am_Slot::operator!=(&local_20->context,slot_invalidated);
    if (bVar1) {
      Am_Slot::Invalidate(&local_20->context,&(this->interface).super_Am_Constraint);
    }
  }
  return;
}

Assistant:

void
Am_Web_Data::Invalidate(const Am_Slot &slot_invalidated)
{
  valid = false;
  Output_Port *curr;
  for (curr = out_list; curr; curr = curr->next) {
    if (curr->context != slot_invalidated)
      curr->context.Invalidate(&interface);
  }
}